

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

translation_t *
opengv::relative_pose::twopt
          (translation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,bool unrotate,
          size_t index0,size_t index1)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined7 in_register_00000011;
  ActualDstType actualDst;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  bearingVector_t f1;
  bearingVector_t f2;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_58,adapter,index0);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_78,adapter,index0);
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_40,adapter,index1);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_98,adapter,index1);
  if ((int)CONCAT71(in_register_00000011,unrotate) == 0) {
    auVar7._8_8_ = dStack_70;
    auVar7._0_8_ = local_78;
    auVar8._8_8_ = dStack_90;
    auVar8._0_8_ = local_98;
  }
  else {
    auVar7 = *(undefined1 (*) [16])
              (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
              .m_data.array;
    auVar8 = *(undefined1 (*) [16])
              ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array + 3);
    dVar14 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
    auVar2 = *(undefined1 (*) [16])
              ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array + 6);
    dVar15 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
    auVar10._8_8_ = local_68;
    auVar10._0_8_ = local_68;
    dVar1 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[2];
    auVar6._8_8_ = local_78;
    auVar6._0_8_ = local_78;
    auVar6 = vmulpd_avx512vl(auVar7,auVar6);
    auVar3._8_8_ = local_98;
    auVar3._0_8_ = local_98;
    auVar7 = vmulpd_avx512vl(auVar7,auVar3);
    auVar4._8_8_ = dStack_70;
    auVar4._0_8_ = dStack_70;
    auVar6 = vfmadd231pd_avx512vl(auVar6,auVar8,auVar4);
    auVar5._8_8_ = dStack_90;
    auVar5._0_8_ = dStack_90;
    auVar8 = vfmadd231pd_avx512vl(auVar7,auVar8,auVar5);
    auVar19._8_8_ = local_88;
    auVar19._0_8_ = local_88;
    auVar7 = vfmadd231pd_fma(auVar6,auVar2,auVar10);
    auVar8 = vfmadd231pd_fma(auVar8,auVar19,auVar2);
    local_68 = dVar1 * local_78 + dVar14 * dStack_70 + local_68 * dVar15;
    local_88 = dVar1 * local_98 + dVar14 * dStack_90 + dVar15 * local_88;
  }
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_88;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_68;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_48;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dStack_50;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_58;
  auVar2 = vshufpd_avx(auVar7,auVar7,1);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_30;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_38;
  auVar6 = vshufpd_avx(auVar8,auVar8,1);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar2._0_8_ * local_48;
  auVar3 = vfmsub231sd_fma(auVar28,auVar24,auVar11);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar6._0_8_ * local_30;
  auVar4 = vfmsub231sd_fma(auVar31,auVar32,auVar16);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_68 * local_58;
  auVar5 = vfmsub231sd_fma(auVar29,auVar27,auVar7);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar7._0_8_ * dStack_50;
  auVar2 = vfmsub231sd_fma(auVar25,auVar20,auVar2);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_40;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_88 * local_40;
  auVar10 = vfmsub231sd_fma(auVar17,auVar8,auVar30);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_38 * auVar8._0_8_;
  auVar8 = vfmsub231sd_fma(auVar12,auVar21,auVar6);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar10._0_8_ * auVar2._0_8_;
  auVar6 = vfmsub231sd_fma(auVar22,auVar5,auVar8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar3._0_8_ * auVar8._0_8_;
  auVar8 = vfmsub231sd_fma(auVar13,auVar4,auVar2);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = auVar6._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar4._0_8_ * auVar5._0_8_;
  auVar6 = vfmsub231sd_fma(auVar26,auVar3,auVar10);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = auVar8._0_8_;
  auVar8 = *(undefined1 (*) [16])
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array;
  dVar15 = auVar6._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar15 * dVar15 + auVar8._0_8_ * auVar8._0_8_ + auVar8._8_8_ * auVar8._8_8_;
  auVar2 = vsqrtpd_avx(auVar18);
  dVar14 = auVar2._0_8_;
  auVar23._8_8_ = dVar14;
  auVar23._0_8_ = dVar14;
  dVar15 = dVar15 / dVar14;
  auVar8 = vdivpd_avx(auVar8,auVar23);
  auVar2._8_8_ = dStack_50;
  auVar2._0_8_ = local_58;
  auVar7 = vsubpd_avx(auVar2,auVar7);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar15;
  if ((local_48 - local_68) * dVar15 + auVar7._0_8_ * auVar8._0_8_ + auVar7._8_8_ * auVar8._8_8_ <
      0.0) {
    auVar9._0_8_ = -dVar15;
    auVar9._8_8_ = auVar6._8_8_ ^ 0x8000000000000000;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = -auVar8._0_8_;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = -auVar8._8_8_;
    dVar14 = (double)vmovlpd_avx(auVar9);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = dVar14;
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::translation_t
opengv::relative_pose::twopt(
    const RelativeAdapterBase & adapter,
    bool unrotate,
    size_t index0,
    size_t index1 )
{
  bearingVector_t f1 = adapter.getBearingVector1(index0);
  bearingVector_t f1prime = adapter.getBearingVector2(index0);
  bearingVector_t f2 = adapter.getBearingVector1(index1);
  bearingVector_t f2prime = adapter.getBearingVector2(index1);

  if(unrotate)
  {
    rotation_t R12 = adapter.getR12();
    f1prime = R12 * f1prime;
    f2prime = R12 * f2prime;
  }

  Eigen::Vector3d normal1 = f1.cross(f1prime);
  Eigen::Vector3d normal2 = f2.cross(f2prime);

  translation_t translation = normal1.cross(normal2);
  translation = translation/translation.norm();

  Eigen::Vector3d opticalFlow = f1 - f1prime;
  if( opticalFlow.dot(translation) < 0 )
    translation = -translation;

  return translation;
}